

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<Fad<double>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<double>_> *Sort
          )

{
  bool bVar1;
  TPZVec<Fad<double>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  iterator e;
  iterator w;
  Fad<double> exps;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  Fad<double> Spq;
  Fad<double> Sqq;
  Fad<double> Spp;
  Fad<double> aux2;
  Fad<double> aux;
  Fad<double> sint;
  Fad<double> cost;
  Fad<double> theta;
  Fad<double> maxval;
  int64_t q;
  int64_t p;
  int64_t j;
  int64_t i;
  int64_t size;
  Fad<double> res;
  int64_t iter;
  Fad<double> *in_stack_fffffffffffff838;
  Fad<double> *in_stack_fffffffffffff840;
  Fad<double> *in_stack_fffffffffffff848;
  Fad<double> *in_stack_fffffffffffff850;
  FadExpr<FadFuncCos<Fad<double>_>_> *in_stack_fffffffffffff858;
  Fad<double> *in_stack_fffffffffffff860;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_fffffffffffff868;
  Fad<double> *in_stack_fffffffffffff870;
  Fad<double> *in_stack_fffffffffffff878;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffff888;
  Fad<double> *in_stack_fffffffffffff890;
  _Self local_668;
  _Rb_tree_const_iterator<double> local_660;
  _Base_ptr local_658;
  REAL local_630;
  undefined8 local_538;
  undefined8 local_480;
  undefined8 local_2a8;
  undefined8 local_248;
  double local_210;
  undefined8 local_208;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  int64_t local_c0;
  undefined8 local_88;
  long local_30;
  TPZVec<Fad<double>_> *local_28;
  double *local_20;
  long *local_18;
  bool local_1;
  
  local_30 = 0;
  local_88 = 0x4000000000000000;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,Fad<double>>>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  local_c0 = TPZBaseMatrix::Rows(in_RDI);
  local_d8 = -1;
  local_e0 = -1;
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  Fad<double>::Fad(in_stack_fffffffffffff850);
  for (; local_30 < *local_18; local_30 = local_30 + 1) {
    local_208 = 0;
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        dVar2 = fabs<double>((Fad<double> *)0x133194a);
        dVar3 = fabs<double>((Fad<double> *)0x1331962);
        if (dVar3 < dVar2) {
          local_d8 = local_c8;
          local_e0 = local_d0;
          operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                     (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
          local_210 = fabs<double>((Fad<double> *)0x13319dd);
          Fad<double>::operator=<double,_nullptr>
                    (in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
        }
      }
    }
    Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    dVar2 = fabs<double>((Fad<double> *)0x1331bd6);
    if (dVar2 < *local_20) break;
    local_248 = 0x3fe0000000000000;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
    local_2a8 = 0x4000000000000000;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff870);
    atan<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>
              (in_stack_fffffffffffff868);
    operator*<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              (in_stack_fffffffffffff878,
               (FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffff870);
    Fad<double>::operator=
              (in_stack_fffffffffffff860,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff858);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    Fad<double>::~Fad(in_stack_fffffffffffff840);
    Fad<double>::~Fad(in_stack_fffffffffffff840);
    cos<double>(in_stack_fffffffffffff878);
    Fad<double>::operator=(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffff840);
    sin<double>(in_stack_fffffffffffff878);
    Fad<double>::operator=
              (in_stack_fffffffffffff860,
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffff858);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffff840);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      if ((local_c8 != local_d8) && (local_c8 != local_e0)) {
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff870);
        Fad<double>::operator=
                  (in_stack_fffffffffffff860,
                   (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffff858);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffff840);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
        Fad<double>::~Fad(in_stack_fffffffffffff840);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
        Fad<double>::~Fad(in_stack_fffffffffffff840);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff870);
        Fad<double>::operator=
                  (in_stack_fffffffffffff860,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffff858);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffff840);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
        Fad<double>::~Fad(in_stack_fffffffffffff840);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
        Fad<double>::~Fad(in_stack_fffffffffffff840);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                   (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
        Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      }
    }
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    local_480 = 0x4000000000000000;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    operator+<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff870);
    Fad<double>::operator=
              (in_stack_fffffffffffff860,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff858);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    Fad<double>::~Fad(in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    local_538 = 0x4000000000000000;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff870);
    Fad<double>::operator=
              (in_stack_fffffffffffff860,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff858);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    Fad<double>::~Fad(in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff870);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
              (in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff870);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff878,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffff870);
    Fad<double>::operator=
              (in_stack_fffffffffffff860,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff858);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff840);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff840);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
               (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
    Fad<double>::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  }
  if (local_28 != (TPZVec<Fad<double>_> *)0x0) {
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x133301e);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      operator()((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff860,
                 (int64_t)in_stack_fffffffffffff858,(int64_t)in_stack_fffffffffffff850);
      Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      Fad<double>::Fad(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      local_630 = TPZExtractVal::val<Fad<double>>((Fad<double> *)0x1333097);
      local_658 = (_Base_ptr)
                  std::multiset<double,_std::less<double>,_std::allocator<double>_>::insert
                            ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                             in_stack_fffffffffffff848,&in_stack_fffffffffffff840->val_);
      Fad<double>::~Fad(in_stack_fffffffffffff840);
      Fad<double>::~Fad(in_stack_fffffffffffff840);
    }
    (*local_28->_vptr_TPZVec[3])(local_28,local_c0);
    std::_Rb_tree_const_iterator<double>::_Rb_tree_const_iterator(&local_660);
    local_668._M_node =
         (_Base_ptr)
         std::multiset<double,_std::less<double>,_std::allocator<double>_>::end
                   ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                    in_stack_fffffffffffff838);
    local_c8 = local_c0 + -1;
    local_660._M_node =
         (_Base_ptr)
         std::multiset<double,_std::less<double>,_std::allocator<double>_>::begin
                   ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                    in_stack_fffffffffffff838);
    while (bVar1 = std::operator!=(&local_660,&local_668), bVar1) {
      std::_Rb_tree_const_iterator<double>::operator*((_Rb_tree_const_iterator<double> *)0x133320a);
      TPZVec<Fad<double>_>::operator[](local_28,local_c8);
      Fad<double>::operator=<double,_nullptr>
                (in_stack_fffffffffffff850,&in_stack_fffffffffffff848->val_);
      std::_Rb_tree_const_iterator<double>::operator++
                ((_Rb_tree_const_iterator<double> *)in_stack_fffffffffffff848,
                 (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
      local_c8 = local_c8 + -1;
    }
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::~multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x133327b);
  }
  dVar3 = fabs<double>((Fad<double> *)0x133329c);
  dVar2 = *local_20;
  if (dVar2 <= dVar3) {
    in_stack_fffffffffffff840 = (Fad<double> *)fabs<double>((Fad<double> *)0x1333318);
    *local_20 = (double)in_stack_fffffffffffff840;
    *local_18 = local_30;
  }
  else {
    dVar4 = fabs<double>((Fad<double> *)0x13332c9);
    *local_20 = dVar4;
    *local_18 = local_30;
  }
  local_1 = dVar2 > dVar3;
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  Fad<double>::~Fad(in_stack_fffffffffffff840);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}